

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

Fl_Color __thiscall Fl_Help_View::get_color(Fl_Help_View *this,char *n,Fl_Color c)

{
  int iVar1;
  Fl_Color FVar2;
  long lVar3;
  size_t sVar4;
  byte local_38;
  uchar local_34;
  int b;
  int g;
  int r;
  int rgb;
  int i;
  Fl_Color c_local;
  char *n_local;
  Fl_Help_View *this_local;
  
  this_local._4_4_ = c;
  if ((n != (char *)0x0) && (*n != '\0')) {
    if (*n == '#') {
      lVar3 = strtol(n + 1,(char **)0x0,0x10);
      sVar4 = strlen(n);
      local_38 = (byte)lVar3;
      local_34 = (uchar)((ulong)lVar3 >> 8);
      if (sVar4 < 5) {
        b._0_1_ = local_34 * '\x11';
        local_34 = ((byte)((int)lVar3 >> 4) & 0xf) * '\x11';
        local_38 = (local_38 & 0xf) * '\x11';
      }
      else {
        b._0_1_ = (uchar)((ulong)lVar3 >> 0x10);
      }
      this_local._4_4_ = fl_rgb_color((uchar)b,local_34,local_38);
    }
    else {
      for (r = 0; r < 0x13; r = r + 1) {
        iVar1 = strcasecmp(n,get_color::colors[r].name);
        if (iVar1 == 0) {
          FVar2 = fl_rgb_color((uchar)get_color::colors[r].r,(uchar)get_color::colors[r].g,
                               (uchar)get_color::colors[r].b);
          return FVar2;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

Fl_Color				// O - Color value
Fl_Help_View::get_color(const char *n,	// I - Color name
                        Fl_Color   c)	// I - Default color value
{
  int	i;				// Looping var
  int	rgb, r, g, b;			// RGB values
  static const struct {			// Color name table
    const char *name;
    int r, g, b;
  }	colors[] = {
    { "black",		0x00, 0x00, 0x00 },
    { "red",		0xff, 0x00, 0x00 },
    { "green",		0x00, 0x80, 0x00 },
    { "yellow",		0xff, 0xff, 0x00 },
    { "blue",		0x00, 0x00, 0xff },
    { "magenta",	0xff, 0x00, 0xff },
    { "fuchsia",	0xff, 0x00, 0xff },
    { "cyan",		0x00, 0xff, 0xff },
    { "aqua",		0x00, 0xff, 0xff },
    { "white",		0xff, 0xff, 0xff },
    { "gray",		0x80, 0x80, 0x80 },
    { "grey",		0x80, 0x80, 0x80 },
    { "lime",		0x00, 0xff, 0x00 },
    { "maroon",		0x80, 0x00, 0x00 },
    { "navy",		0x00, 0x00, 0x80 },
    { "olive",		0x80, 0x80, 0x00 },
    { "purple",		0x80, 0x00, 0x80 },
    { "silver",		0xc0, 0xc0, 0xc0 },
    { "teal",		0x00, 0x80, 0x80 }
  };


  if (!n || !n[0]) return c;

  if (n[0] == '#') {
    // Do hex color lookup
    rgb = strtol(n + 1, NULL, 16);

    if (strlen(n) > 4) {
      r = rgb >> 16;
      g = (rgb >> 8) & 255;
      b = rgb & 255;
    } else {
      r = (rgb >> 8) * 17;
      g = ((rgb >> 4) & 15) * 17;
      b = (rgb & 15) * 17;
    }
    return (fl_rgb_color((uchar)r, (uchar)g, (uchar)b));
  } else {
    for (i = 0; i < (int)(sizeof(colors) / sizeof(colors[0])); i ++)
      if (!strcasecmp(n, colors[i].name)) {
        return fl_rgb_color(colors[i].r, colors[i].g, colors[i].b);
      }
    return c;
  }
}